

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldOptions_FeatureSupport::Clear(FieldOptions_FeatureSupport *this)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t cached_has_bits;
  FieldOptions_FeatureSupport *this_local;
  
  puVar2 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 1) != 0) {
    internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.deprecation_warning_);
  }
  if ((uVar1 & 0xe) != 0) {
    memset((void *)((long)&this->field_0 + 0x10),0,0xc);
  }
  internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FieldOptions_FeatureSupport::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FieldOptions.FeatureSupport)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _impl_.deprecation_warning_.ClearNonDefaultToEmpty();
  }
  if ((cached_has_bits & 0x0000000eu) != 0) {
    ::memset(&_impl_.edition_introduced_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.edition_removed_) -
        reinterpret_cast<char*>(&_impl_.edition_introduced_)) + sizeof(_impl_.edition_removed_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}